

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarray2.c
# Opt level: O0

SparseArray * SparseArrayCopy(SparseArray *sarray)

{
  SparseArray *pSVar1;
  SparseArray *__dest;
  SparseArray *child;
  uint i;
  SparseArray *copy;
  SparseArray *sarray_local;
  
  __dest = (SparseArray *)calloc(0x808,1);
  memcpy(__dest,sarray,0x808);
  __dest->refCount = 1;
  if (sarray->shift != 0) {
    for (child._4_4_ = 0; child._4_4_ < 0x100; child._4_4_ = child._4_4_ + 1) {
      pSVar1 = (SparseArray *)__dest->data[child._4_4_];
      if ((((pSVar1 != &EmptyArray) && (pSVar1 != &EmptyArray8)) && (pSVar1 != &EmptyArray16)) &&
         (pSVar1 != &EmptyArray24)) {
        LOCK();
        pSVar1->refCount = pSVar1->refCount + 1;
        UNLOCK();
      }
    }
  }
  return __dest;
}

Assistant:

PRIVATE SparseArray *SparseArrayCopy(SparseArray * sarray)
{
	SparseArray *copy = calloc(sizeof(SparseArray), 1);
	memcpy(copy, sarray, sizeof(SparseArray));
	copy->refCount = 1;
	// If the sarray has children, increase their refcounts and link them
	if (sarray->shift > 0)
	{
		for (unsigned int i = 0 ; i<=MAX_INDEX(sarray); i++)
		{
			SparseArray *child = copy->data[i];
			if (!(child == &EmptyArray ||
			    child == &EmptyArray8 ||
			    child == &EmptyArray16 ||
			    child == &EmptyArray24))
			{
				__sync_fetch_and_add(&child->refCount, 1);
			}
			// Non-lazy copy.  Uncomment if debugging 
			// copy->data[i] = SparseArrayCopy(copy->data[i]);
		}
	}
	return copy;
}